

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

string * __thiscall
fmt::v7::detail::vformat_abi_cxx11_
          (string *__return_storage_ptr__,detail *this,string_view format_str,format_args args)

{
  size_t *psVar1;
  unsigned_long_long value;
  size_t sVar2;
  undefined1 value_00 [16];
  undefined1 value_01 [16];
  undefined4 uVar3;
  bool bVar4;
  undefined2 uVar5;
  float value_02;
  detail *this_00;
  type tVar6;
  basic_string_view<char> format_str_00;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args_00;
  undefined1 local_258 [8];
  memory_buffer buffer;
  stringifier local_31;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *buf;
  
  args_00.field_1 =
       (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
        )args.
         super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
         .desc_;
  args_00.desc_ = format_str.size_;
  format_str_00.size_ = format_str.data_;
  if ((format_str_00.size_ == (char *)0x2) &&
     (this_00 = this, bVar4 = equal2((char *)this,"{}"), uVar3 = local_258._4_4_, bVar4)) {
    if ((long)args_00.desc_ < 0) {
      if (((int)(type)format_str.size_ < 1) ||
         (tVar6 = (args_00.field_1.args_)->type_, tVar6 == none_type)) goto LAB_00208aca;
    }
    else {
      tVar6 = (type)format_str.size_ & custom_type;
      if (((undefined1  [16])format_str & (undefined1  [16])0xf) == (undefined1  [16])0x0) {
LAB_00208aca:
        error_handler::on_error((error_handler *)this_00,"argument not found");
      }
    }
    value = ((args_00.field_1.values_)->field_0).ulong_long_value;
    sVar2 = ((args_00.field_1.values_)->field_0).string.size;
    value_02 = (float)value;
    uVar5 = (undefined2)sVar2;
    local_258._4_4_ = (undefined4)(value >> 0x20);
    switch(tVar6) {
    case int_type:
      to_string<int,_0>(__return_storage_ptr__,(int)value_02);
      break;
    case uint_type:
      to_string<unsigned_int,_0>(__return_storage_ptr__,(uint)value_02);
      break;
    case long_long_type:
      to_string<long_long,_0>(__return_storage_ptr__,value);
      break;
    case ulong_long_type:
      to_string<unsigned_long_long,_0>(__return_storage_ptr__,value);
      break;
    case int128_type:
      value_00._4_4_ = uVar3;
      value_00._0_4_ = local_258._0_4_;
      value_00._8_2_ = buffer.super_buffer<char>._vptr_buffer._0_2_;
      value_00._10_6_ = buffer.super_buffer<char>._vptr_buffer._2_6_;
      to_string<__int128,_0>(__return_storage_ptr__,(__int128)value_00);
      break;
    case uint128_type:
      value_01._4_4_ = uVar3;
      value_01._0_4_ = local_258._0_4_;
      value_01._8_2_ = buffer.super_buffer<char>._vptr_buffer._0_2_;
      value_01._10_6_ = buffer.super_buffer<char>._vptr_buffer._2_6_;
      to_string<unsigned___int128,_0>(__return_storage_ptr__,(unsigned___int128)value_01);
      break;
    case bool_type:
      to_string<bool,_0>(__return_storage_ptr__,(bool)((byte)value & 1));
      break;
    case char_type:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = (byte)value;
      __return_storage_ptr__->_M_string_length = 1;
      (__return_storage_ptr__->field_2)._M_local_buf[1] = '\0';
      break;
    case float_type:
      local_258._0_4_ = value_02;
      to_string<float,_0>(__return_storage_ptr__,(float *)local_258);
      break;
    case double_type:
      local_258._0_4_ = value_02;
      to_string<double,_0>(__return_storage_ptr__,(double *)local_258);
      break;
    case last_numeric_type:
      local_258._0_4_ = value_02;
      buffer.super_buffer<char>._vptr_buffer._0_2_ = uVar5;
      to_string<long_double,_0>(__return_storage_ptr__,(longdouble *)local_258);
      break;
    case cstring_type:
      local_258._0_4_ = value_02;
      to_string<const_char_*,_0>(__return_storage_ptr__,(char **)local_258);
      break;
    case string_type:
      buffer.super_buffer<char>._vptr_buffer._2_6_ = (undefined6)(sVar2 >> 0x10);
      local_258._0_4_ = value_02;
      buffer.super_buffer<char>._vptr_buffer._0_2_ = uVar5;
      to_string<fmt::v7::basic_string_view<char>,_0>
                (__return_storage_ptr__,(basic_string_view<char> *)local_258);
      break;
    case pointer_type:
      local_258._0_4_ = value_02;
      to_string<const_void_*,_0>(__return_storage_ptr__,(void **)local_258);
      break;
    case custom_type:
      stringifier::operator()[abi_cxx11_
                (__return_storage_ptr__,&local_31,
                 (handle)((args_00.field_1.values_)->field_0).string);
      break;
    default:
      to_string<fmt::v7::monostate,_0>(__return_storage_ptr__,(monostate *)local_258);
    }
  }
  else {
    psVar1 = &buffer.super_buffer<char>.capacity_;
    buffer.super_buffer<char>.ptr_ = (char *)0x0;
    local_258._0_4_ = 3.941752e-39;
    local_258._4_4_ = 0;
    buffer.super_buffer<char>._vptr_buffer._0_2_ = SUB82(psVar1,0);
    buffer.super_buffer<char>._vptr_buffer._2_6_ = (undefined6)((ulong)psVar1 >> 0x10);
    buffer.super_buffer<char>.size_ = 500;
    format_str_00.data_ = (char *)this;
    vformat_to<char>((buffer<char> *)local_258,format_str_00,args_00);
    to_string<char,500ul>(__return_storage_ptr__,(v7 *)local_258,buf);
    basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
              ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_258);
  }
  return __return_storage_ptr__;
}

Assistant:

FMT_FUNC std::string detail::vformat(string_view format_str, format_args args) {
  if (format_str.size() == 2 && equal2(format_str.data(), "{}")) {
    auto arg = args.get(0);
    if (!arg) error_handler().on_error("argument not found");
    return visit_format_arg(stringifier(), arg);
  }
  memory_buffer buffer;
  detail::vformat_to(buffer, format_str, args);
  return to_string(buffer);
}